

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

istream * maths::operator>>(istream *is,Matrix *m)

{
  int j;
  long lVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < m->rows_; lVar2 = lVar2 + 1) {
    for (lVar1 = 0; lVar1 < m->cols_; lVar1 = lVar1 + 1) {
      std::istream::_M_extract<double>((double *)is);
    }
  }
  return is;
}

Assistant:

istream& operator>>(istream& is, Matrix& m)
{
    for (int i = 0; i < m.rows_; ++i) {
        for (int j = 0; j < m.cols_; ++j) {
            is >> m.p[i][j];
        }
    }
    return is;
}